

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O2

int xmlRegexpExec(xmlRegexpPtr comp,xmlChar *content)

{
  xmlRegAtomPtr pxVar1;
  xmlRegStatePtr pxVar2;
  void *pvVar3;
  xmlRegStatePtr pxVar4;
  xmlRegExecRollback *pxVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  xmlRegTrans *pxVar11;
  ulong uVar12;
  bool bVar13;
  int local_cc;
  xmlRegExecCtxt execval;
  
  if (content != (xmlChar *)0x0 && comp != (xmlRegexpPtr)0x0) {
    execval.index = 0;
    execval.nbPush = 0;
    execval.status = 0;
    execval.determinist = 1;
    execval.maxRollbacks = 0;
    execval.nbRollbacks = 0;
    execval.rollbacks = (xmlRegExecRollback *)0x0;
    execval.state = *comp->states;
    execval.transno = 0;
    execval.transcount = 0;
    execval.inputStack = (xmlRegInputTokenPtr)0x0;
    execval.inputStackMax = 0;
    execval.comp = comp;
    execval.inputString = content;
    if ((long)comp->nbCounters < 1) {
      execval.counts = (int *)0x0;
    }
    else {
      execval.counts = (int *)(*xmlMalloc)((long)comp->nbCounters << 2);
      if (execval.counts == (int *)0x0) {
        xmlRegexpErrMemory((xmlRegParserCtxtPtr)0x0,"running regexp");
        return -1;
      }
      memset(execval.counts,0,(long)comp->nbCounters << 2);
    }
    iVar8 = 0;
LAB_0019c6f1:
    if (((iVar8 == 0) && (iVar8 = 0, execval.state != (xmlRegStatePtr)0x0)) &&
       ((execval.inputString[execval.index] != '\0' ||
        ((execval.state)->type != XML_REGEXP_FINAL_STATE)))) {
      local_cc = 1;
      if ((execval.inputString[execval.index] != '\0') || (execval.counts != (int *)0x0)) {
LAB_0019c779:
        execval.transcount = 0;
LAB_0019c77e:
        iVar8 = execval.transno;
        pxVar4 = execval.state;
        if ((execval.state)->nbTrans <= execval.transno) goto LAB_0019cabb;
        if ((execval.state)->trans[execval.transno].to < 0) goto LAB_0019c9f7;
        pxVar11 = (execval.state)->trans + execval.transno;
        lVar9 = (long)pxVar11->count;
        if (-1 < lVar9) {
          if (execval.counts == (int *)0x0) {
LAB_0019cae3:
            iVar8 = -1;
            goto LAB_0019cae7;
          }
          iVar8 = (execval.comp)->counters[lVar9].min;
          if ((execval.counts[lVar9] < iVar8) ||
             (iVar6 = (execval.comp)->counters[lVar9].max, iVar6 < execval.counts[lVar9]))
          goto LAB_0019c9f7;
          bVar13 = iVar8 != iVar6;
LAB_0019c97d:
          if ((pxVar11->nd == 1) ||
             ((bVar13 && -1 < pxVar11->count && (execval.transno + 1 < (execval.state)->nbTrans))))
          {
            xmlFARegExecSave(&execval);
          }
          lVar9 = (long)pxVar11->counter;
          if (-1 < lVar9) {
            if (((execval.counts == (int *)0x0) || (execval.comp == (xmlRegexpPtr)0x0)) ||
               ((execval.comp)->counters == (xmlRegCounter *)0x0)) goto LAB_0019cae3;
            if ((execval.comp)->counters[lVar9].max <= execval.counts[lVar9]) goto LAB_0019c9f7;
            execval.counts[lVar9] = execval.counts[lVar9] + 1;
          }
          if ((ulong)(uint)pxVar11->count < 0x123456) {
            if (execval.counts == (int *)0x0) goto LAB_0019cae3;
            execval.counts[(uint)pxVar11->count] = 0;
          }
          execval.state = comp->states[pxVar11->to];
          execval.transno = 0;
          if (pxVar11->atom != (xmlRegAtomPtr)0x0) {
            execval.index = execval.index + local_cc;
          }
          goto LAB_0019cacf;
        }
        pxVar1 = pxVar11->atom;
        if (pxVar1 == (xmlRegAtomPtr)0x0) {
          fwrite("epsilon transition left at runtime\n",0x23,1,_stderr);
          iVar6 = -2;
LAB_0019cab6:
          execval.status = iVar6;
          goto LAB_0019cabb;
        }
        if (execval.inputString[execval.index] == '\0') {
LAB_0019c958:
          if ((pxVar1->min == 0) && (0 < pxVar1->max)) {
            execval.transcount = 1;
            local_cc = 0;
LAB_0019c97b:
            bVar13 = false;
            goto LAB_0019c97d;
          }
        }
        else {
          iVar6 = xmlStringCurrentChar
                            ((xmlParserCtxtPtr)0x0,execval.inputString + execval.index,&local_cc);
          iVar6 = xmlRegCheckCharacter(pxVar1,iVar6);
          if (iVar6 == 0) goto LAB_0019c958;
          if (iVar6 == 1) {
            if ((-1 < pxVar1->min) && (0 < pxVar1->max)) {
              pxVar2 = comp->states[pxVar11->to];
              uVar7 = pxVar11->counter;
              lVar9 = (long)(int)uVar7;
              if (-1 < lVar9) {
                if (((execval.counts == (int *)0x0) || (execval.comp == (xmlRegexpPtr)0x0)) ||
                   ((execval.comp)->counters == (xmlRegCounter *)0x0)) goto LAB_0019cae3;
                if ((execval.comp)->counters[lVar9].max <= execval.counts[lVar9]) goto LAB_0019c9f7;
              }
              if (iVar8 + 1 < pxVar4->nbTrans) {
                xmlFARegExecSave(&execval);
                uVar7 = pxVar11->counter;
              }
              if (-1 < (int)uVar7) {
                execval.counts[uVar7] = execval.counts[uVar7] + 1;
              }
              execval.transcount = 1;
              do {
                iVar8 = execval.transno;
                pxVar4 = execval.state;
                if (execval.transcount == pxVar1->max) {
LAB_0019ca12:
                  iVar8 = 1;
                  break;
                }
                lVar9 = (long)local_cc + (long)execval.index;
                if (execval.inputString[lVar9] == '\0') goto LAB_0019ca12;
                execval.index = (int)lVar9;
                if (pxVar1->min <= execval.transcount) {
                  execval.transno = -1;
                  execval.state = pxVar2;
                  xmlFARegExecSave(&execval);
                  lVar9 = (long)execval.index;
                }
                execval.state = pxVar4;
                execval.transno = iVar8;
                iVar8 = xmlStringCurrentChar
                                  ((xmlParserCtxtPtr)0x0,execval.inputString + lVar9,&local_cc);
                iVar8 = xmlRegCheckCharacter(pxVar1,iVar8);
                execval.transcount = execval.transcount + 1;
              } while (iVar8 == 1);
              if (execval.transcount < pxVar1->min) {
                iVar8 = 0;
              }
              if (0 < iVar8) {
                if (-1 < (long)pxVar11->counter) {
                  if (execval.counts == (int *)0x0) goto LAB_0019cae3;
                  execval.counts[pxVar11->counter] = execval.counts[pxVar11->counter] + -1;
                }
                if (iVar8 != 1) goto LAB_0019c9f7;
                goto LAB_0019c97b;
              }
              goto LAB_0019cac0;
            }
            goto LAB_0019c97b;
          }
          if (iVar6 < 0) {
            iVar6 = -4;
            goto LAB_0019cab6;
          }
        }
LAB_0019c9f7:
        execval.transno = execval.transno + 1;
        goto LAB_0019c77e;
      }
      if (execval.transno < (execval.state)->nbTrans) {
        if (((execval.state)->trans[execval.transno].to < 0) ||
           ((pxVar1 = (execval.state)->trans[execval.transno].atom, pxVar1->min == 0 &&
            (0 < pxVar1->max)))) goto LAB_0019c779;
      }
      goto LAB_0019cac0;
    }
LAB_0019cae7:
    pxVar5 = execval.rollbacks;
    if (execval.rollbacks != (xmlRegExecRollback *)0x0) {
      if (execval.counts != (int *)0x0) {
        uVar12 = 0;
        uVar10 = execval._48_8_ & 0xffffffff;
        if (execval.maxRollbacks < 1) {
          uVar10 = uVar12;
        }
        for (; uVar10 * 0x18 - uVar12 != 0; uVar12 = uVar12 + 0x18) {
          pvVar3 = *(void **)((long)&pxVar5->counts + uVar12);
          if (pvVar3 != (void *)0x0) {
            (*xmlFree)(pvVar3);
          }
        }
      }
      (*xmlFree)(pxVar5);
    }
    if (execval.state != (xmlRegStatePtr)0x0) {
      if (execval.counts != (int *)0x0) {
        (*xmlFree)(execval.counts);
      }
      if (iVar8 != 0) {
        if (iVar8 == -1) {
          return -(uint)(10000000 < execval.nbPush);
        }
        return iVar8;
      }
      return 1;
    }
  }
  return -1;
LAB_0019cabb:
  if ((iVar8 != 0) || (pxVar4->nbTrans == 0)) {
LAB_0019cac0:
    execval._0_8_ = execval._0_8_ & 0xffffffff;
    xmlFARegExecRollBack(&execval);
  }
LAB_0019cacf:
  iVar8 = execval.status;
  goto LAB_0019c6f1;
}

Assistant:

int
xmlRegexpExec(xmlRegexpPtr comp, const xmlChar *content) {
    if ((comp == NULL) || (content == NULL))
	return(-1);
    return(xmlFARegExec(comp, content));
}